

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O3

bool __thiscall cmDocumentation::PrintRequestedDocumentation(cmDocumentation *this,ostream *os)

{
  pointer pRVar1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  bool bVar4;
  pointer pRVar5;
  int iVar6;
  ostream *os_00;
  int iVar7;
  ofstream fout;
  bool local_25c;
  undefined1 local_230 [248];
  ios_base local_138 [264];
  
  uVar3 = _vtable;
  pp_Var2 = _VTT;
  pRVar5 = (this->RequestedHelpItems).
           super__Vector_base<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->RequestedHelpItems).
           super__Vector_base<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar5 == pRVar1) {
    local_25c = true;
  }
  else {
    local_25c = true;
    iVar6 = 0;
    do {
      std::__cxx11::string::_M_assign((string *)&this->CurrentArgument);
      std::ofstream::ofstream((ostream *)local_230);
      if ((pRVar5->Filename)._M_string_length == 0) {
        iVar7 = iVar6 + 1;
        bVar4 = 0 < iVar6;
        os_00 = os;
        iVar6 = iVar7;
        if (bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n\n",2);
        }
      }
      else {
        std::ofstream::open((char *)local_230,(_Ios_Openmode)(pRVar5->Filename)._M_dataplus._M_p);
        os_00 = (ostream *)local_230;
      }
      bVar4 = PrintDocumentation(this,pRVar5->HelpType,os_00);
      if ((!bVar4) || (((&os_00->field_0x20)[(long)os_00->_vptr_basic_ostream[-3]] & 5) != 0)) {
        local_25c = false;
      }
      local_230._0_8_ = pp_Var2;
      *(undefined8 *)(local_230 + (long)pp_Var2[-3]) = uVar3;
      std::filebuf::~filebuf((filebuf *)(local_230 + 8));
      std::ios_base::~ios_base(local_138);
      pRVar5 = pRVar5 + 1;
    } while (pRVar5 != pRVar1);
  }
  return local_25c;
}

Assistant:

bool cmDocumentation::PrintRequestedDocumentation(std::ostream& os)
{
  int count = 0;
  bool result = true;

  // Loop over requested documentation types.
  for (RequestedHelpItem const& rhi : this->RequestedHelpItems) {
    this->CurrentArgument = rhi.Argument;
    // If a file name was given, use it.  Otherwise, default to the
    // given stream.
    cmsys::ofstream fout;
    std::ostream* s = &os;
    if (!rhi.Filename.empty()) {
      fout.open(rhi.Filename.c_str());
      s = &fout;
    } else if (++count > 1) {
      os << "\n\n";
    }

    // Print this documentation type to the stream.
    if (!this->PrintDocumentation(rhi.HelpType, *s) || s->fail()) {
      result = false;
    }
  }
  return result;
}